

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

char * ts_string_input_read(void *_self,uint32_t byte,TSPoint _,uint32_t *length)

{
  TSStringInput *self;
  uint32_t *length_local;
  uint32_t byte_local;
  void *_self_local;
  TSPoint __local;
  
  if (byte < *(uint *)((long)_self + 8)) {
    *length = *(int *)((long)_self + 8) - byte;
    __local = (TSPoint)(*_self + (ulong)byte);
  }
  else {
    *length = 0;
    __local = (TSPoint)((long)"\"\n}\n\n" + 5);
  }
  return (char *)__local;
}

Assistant:

static const char *ts_string_input_read(void *_self, uint32_t byte, TSPoint _, uint32_t *length) {
  TSStringInput *self = (TSStringInput *)_self;
  if (byte >= self->length) {
    *length = 0;
    return "";
  } else {
    *length = self->length - byte;
    return self->string + byte;
  }
}